

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsRectItem::setRect(QGraphicsRectItem *this,QRectF *rect)

{
  long lVar1;
  bool bVar2;
  QGraphicsRectItemPrivate *lhs;
  qreal *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsRectItemPrivate *d;
  QRectF *in_stack_ffffffffffffffb8;
  QGraphicsItem *in_stack_ffffffffffffffc0;
  qreal local_28;
  qreal local_20;
  QGraphicsItem *in_stack_ffffffffffffffe8;
  qreal local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QGraphicsRectItem *)0x9886fe);
  bVar2 = ::operator==((QRectF *)lhs,in_RDI);
  if (!bVar2) {
    QGraphicsItem::prepareGeometryChange(in_stack_ffffffffffffffe8);
    (lhs->rect).xp = *in_RSI;
    (lhs->rect).yp = in_RSI[1];
    (lhs->rect).w = in_RSI[2];
    (lhs->rect).h = in_RSI[3];
    QRectF::QRectF((QRectF *)&local_28);
    (lhs->super_QAbstractGraphicsShapeItemPrivate).boundingRect.xp = local_28;
    (lhs->super_QAbstractGraphicsShapeItemPrivate).boundingRect.yp = local_20;
    (lhs->super_QAbstractGraphicsShapeItemPrivate).boundingRect.w = (qreal)in_stack_ffffffffffffffe8
    ;
    (lhs->super_QAbstractGraphicsShapeItemPrivate).boundingRect.h = local_10;
    QRectF::QRectF((QRectF *)&stack0xffffffffffffffb8);
    QGraphicsItem::update(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsRectItem::setRect(const QRectF &rect)
{
    Q_D(QGraphicsRectItem);
    if (d->rect == rect)
        return;
    prepareGeometryChange();
    d->rect = rect;
    d->boundingRect = QRectF();
    update();
}